

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_flac__read_utf8_coded_number
                    (ma_dr_flac_bs *bs,ma_uint64 *pNumberOut,ma_uint8 *pCRCOut)

{
  ma_bool32 mVar1;
  byte *in_RDX;
  ulong *in_RSI;
  int i;
  int byteCount;
  ma_uint8 utf8 [7];
  ma_uint64 result;
  ma_uint8 crc;
  ma_uint64 leftoverDataMask_1;
  ma_uint32 leftoverBits_1;
  ma_uint32 wholeBytes_1;
  ma_uint64 leftoverDataMask;
  ma_uint32 leftoverBits;
  ma_uint32 wholeBytes;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar2;
  int local_90;
  int local_8c;
  byte local_87 [7];
  ulong local_80;
  byte local_71;
  byte *local_70;
  ulong *local_68;
  ma_result local_54;
  undefined8 local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint local_38;
  byte local_31;
  undefined8 local_30;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  uint local_18;
  byte local_11;
  byte bStack_9;
  byte bStack_2;
  byte bStack_1;
  
  local_70 = in_RDX;
  local_68 = in_RSI;
  memset(local_87,0,7);
  local_71 = *local_70;
  mVar1 = ma_dr_flac__read_uint8
                    ((ma_dr_flac_bs *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (ma_uint8 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (mVar1 == 0) {
    *local_68 = 0;
    local_54 = MA_AT_END;
  }
  else {
    local_18 = (uint)local_87[0];
    local_1c = 8;
    local_20 = 1;
    local_24 = 0;
    local_30 = ma_dr_flac_crc8(unsigned_char,unsigned_int,unsigned_int)::leftoverDataMaskTable._0_8_
    ;
    uVar2 = CONCAT31((int3)((uint)in_stack_ffffffffffffff64 >> 8),local_71);
    local_11 = ma_dr_flac__crc8_table[(int)(uint)(local_71 ^ local_87[0])];
    bStack_9 = local_71;
    if ((local_87[0] & 0x80) == 0) {
      *local_68 = (ulong)local_87[0];
      *local_70 = local_11;
      local_54 = MA_SUCCESS;
    }
    else {
      if ((local_87[0] & 0xe0) == 0xc0) {
        local_8c = 2;
      }
      else if ((local_87[0] & 0xf0) == 0xe0) {
        local_8c = 3;
      }
      else if ((local_87[0] & 0xf8) == 0xf0) {
        local_8c = 4;
      }
      else if ((local_87[0] & 0xfc) == 0xf8) {
        local_8c = 5;
      }
      else if ((local_87[0] & 0xfe) == 0xfc) {
        local_8c = 6;
      }
      else {
        if (local_87[0] != 0xfe) {
          *local_68 = 0;
          return MA_CRC_MISMATCH;
        }
        local_8c = 7;
      }
      local_80 = (ulong)(int)((uint)local_87[0] & 0xff >> (char)local_8c + 1);
      local_71 = local_11;
      for (local_90 = 1; local_90 < local_8c; local_90 = local_90 + 1) {
        mVar1 = ma_dr_flac__read_uint8
                          ((ma_dr_flac_bs *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                           (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (ma_uint8 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                          );
        if (mVar1 == 0) {
          *local_68 = 0;
          return MA_AT_END;
        }
        bStack_2 = local_87[local_90];
        local_31 = local_71;
        local_38 = (uint)bStack_2;
        local_3c = 8;
        local_40 = 1;
        local_44 = 0;
        local_50 = ma_dr_flac_crc8(unsigned_char,unsigned_int,unsigned_int)::leftoverDataMaskTable.
                   _0_8_;
        in_stack_ffffffffffffff58 = 0;
        in_stack_ffffffffffffff54 = CONCAT31((int3)((uint)in_stack_ffffffffffffff54 >> 8),local_71);
        bStack_1 = local_71;
        local_31 = ma_dr_flac__crc8_table[(int)(uint)(local_71 ^ bStack_2)];
        local_71 = local_31;
        local_80 = local_80 << 6 | (long)(int)(local_87[local_90] & 0x3f);
      }
      *local_68 = local_80;
      *local_70 = local_71;
      local_54 = MA_SUCCESS;
    }
  }
  return local_54;
}

Assistant:

static ma_result ma_dr_flac__read_utf8_coded_number(ma_dr_flac_bs* bs, ma_uint64* pNumberOut, ma_uint8* pCRCOut)
{
    ma_uint8 crc;
    ma_uint64 result;
    ma_uint8 utf8[7] = {0};
    int byteCount;
    int i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pNumberOut != NULL);
    MA_DR_FLAC_ASSERT(pCRCOut != NULL);
    crc = *pCRCOut;
    if (!ma_dr_flac__read_uint8(bs, 8, utf8)) {
        *pNumberOut = 0;
        return MA_AT_END;
    }
    crc = ma_dr_flac_crc8(crc, utf8[0], 8);
    if ((utf8[0] & 0x80) == 0) {
        *pNumberOut = utf8[0];
        *pCRCOut = crc;
        return MA_SUCCESS;
    }
    if ((utf8[0] & 0xE0) == 0xC0) {
        byteCount = 2;
    } else if ((utf8[0] & 0xF0) == 0xE0) {
        byteCount = 3;
    } else if ((utf8[0] & 0xF8) == 0xF0) {
        byteCount = 4;
    } else if ((utf8[0] & 0xFC) == 0xF8) {
        byteCount = 5;
    } else if ((utf8[0] & 0xFE) == 0xFC) {
        byteCount = 6;
    } else if ((utf8[0] & 0xFF) == 0xFE) {
        byteCount = 7;
    } else {
        *pNumberOut = 0;
        return MA_CRC_MISMATCH;
    }
    MA_DR_FLAC_ASSERT(byteCount > 1);
    result = (ma_uint64)(utf8[0] & (0xFF >> (byteCount + 1)));
    for (i = 1; i < byteCount; ++i) {
        if (!ma_dr_flac__read_uint8(bs, 8, utf8 + i)) {
            *pNumberOut = 0;
            return MA_AT_END;
        }
        crc = ma_dr_flac_crc8(crc, utf8[i], 8);
        result = (result << 6) | (utf8[i] & 0x3F);
    }
    *pNumberOut = result;
    *pCRCOut = crc;
    return MA_SUCCESS;
}